

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

void qcc_stream_init(qcc_stream *self,qcc_stream_data *data,qcc_arena *arena)

{
  qcc_stream_node *pqVar1;
  
  self->arena = arena;
  if (data == (qcc_stream_data *)0x0) {
    qcc_list_init((qcc_list *)&self->data);
    _generate_data(self);
  }
  else {
    pqVar1 = data->last;
    (self->data).first = data->first;
    (self->data).last = pqVar1;
  }
  self->is_writing = (uint)(data == (qcc_stream_data *)0x0);
  self->node = (self->data).first;
  qcc_list_init((qcc_list *)&self->interval_data);
  qcc_list_init((qcc_list *)&self->interval_stack);
  self->is_overrun = 0;
  return;
}

Assistant:

void qcc_stream_init(struct qcc_stream *self,
                     const struct qcc_stream_data *data,
                     struct qcc_arena *arena)
{
    self->arena = arena;
    if (data)
    {
        self->data = *data;
        self->is_writing = 0;
    }
    else
    {
        qcc_stream_data_init(&self->data);
        _generate_data(self);
        self->is_writing = 1;
    }
    self->node = self->data.first;
    qcc_interval_data_init(&self->interval_data);
    qcc_interval_data_init(&self->interval_stack);
    self->is_overrun = 0;
}